

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O1

int main(int argc,char **argv)

{
  ushort uVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  unsigned_short max;
  unsigned_short max_00;
  unsigned_short uVar5;
  thread tVar6;
  uint __len;
  long lVar7;
  thread send_game;
  thread recv_gui;
  thread send_gui;
  thread recv_game;
  int off;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  server_address;
  thread local_f8;
  string local_f0;
  thread local_d0;
  undefined1 local_c8 [40];
  _Alloc_hider a_Stack_a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined4 local_7c;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  
  session_id = time((time_t *)0x0);
  if (argc < 3) {
    puts(&DAT_0010831a);
    exit(1);
  }
  pcVar2 = argv[1];
  sVar4 = strlen(pcVar2);
  if (0x40 < sVar4) {
    util::fatal("Given player name (%s) is longer than 64 chars\n",pcVar2);
  }
  std::__cxx11::string::string((string *)&local_78,argv[1],(allocator *)local_c8);
  std::__cxx11::string::operator=((string *)&player_name_abi_cxx11_,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_78.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Tuple_impl<1UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl + 0x10U)) {
    operator_delete(local_78.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p,
                    local_78.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl.field_2._M_allocated_capacity + 1);
  }
  iVar3 = std::__cxx11::string::compare((char *)&player_name_abi_cxx11_);
  if (iVar3 == 0) {
    std::__cxx11::string::_M_replace
              (0x10d428,0,(char *)player_name_abi_cxx11_._M_string_length,0x1080dd);
  }
  std::__cxx11::string::string((string *)local_c8,argv[2],(allocator *)&local_f0);
  anon_unknown.dwarf_90f3::split_hostname(&local_78,(string *)local_c8);
  if (local_c8._0_8_ != (long)local_c8 + 0x10U) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  uVar5 = (short)&local_78 + 0x28;
  std::__cxx11::string::_M_assign((string *)&servers[0].hostname);
  if (local_78.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Tuple_impl<1UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super__Head_base<1UL,_bool,_false>._M_head_impl == true) {
    servers[0].port =
         anon_unknown.dwarf_90f3::parse<unsigned_short>
                   (local_78.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p,uVar5,max);
  }
  if (argc != 3) {
    std::__cxx11::string::string((string *)&local_f0,argv[3],(allocator *)&local_f8);
    anon_unknown.dwarf_90f3::split_hostname
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_c8,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    uVar5 = (unsigned_short)a_Stack_a0;
    std::__cxx11::string::_M_assign((string *)&servers[1].hostname);
    if (local_c8[0x20] == true) {
      servers[1].port =
           anon_unknown.dwarf_90f3::parse<unsigned_short>((char *)local_c8._0_8_,uVar5,max_00);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)a_Stack_a0[0]._M_p != &local_90) {
      operator_delete(a_Stack_a0[0]._M_p,local_90._M_allocated_capacity + 1);
    }
    if (local_c8._0_8_ != (long)local_c8 + 0x10U) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
  }
  lVar7 = 0;
  do {
    uVar1 = *(ushort *)((long)&servers[0].port + lVar7);
    __len = 1;
    if (((9 < uVar1) && (__len = 2, 99 < uVar1)) && (__len = 3, 999 < uVar1)) {
      __len = 5 - (uVar1 < 10000);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_f0,(char)__len);
    pcVar2 = servers[0].addr.__ss_padding + lVar7 + -10;
    std::__detail::__to_chars_10_impl<unsigned_int>(local_f0._M_dataplus._M_p,__len,(uint)uVar1);
    local_c8._0_8_ = 0;
    local_c8._16_8_ = 0;
    local_c8._24_8_ = 0;
    local_c8._32_8_ = (char *)0x0;
    a_Stack_a0[0]._M_p = (pointer)0x0;
    local_c8._12_4_ = 0;
    local_c8._8_4_ = *(uint *)((long)&servers[0].desired_socktype + lVar7);
    iVar3 = getaddrinfo(*(char **)((long)&servers[0].hostname._M_dataplus._M_p + lVar7),
                        local_f0._M_dataplus._M_p,(addrinfo *)local_c8,(addrinfo **)&local_f8);
    tVar6._M_id._M_thread = local_f8._M_id._M_thread;
    if (iVar3 != 0) {
      util::fatal("Couldn\'t resolve %s",
                  *(undefined8 *)((long)&servers[0].hostname._M_dataplus._M_p + lVar7));
      tVar6._M_id._M_thread = local_f8._M_id._M_thread;
    }
    for (; tVar6._M_id._M_thread != 0;
        tVar6._M_id._M_thread = (id)(id)*(addrinfo **)((long)tVar6._M_id._M_thread + 0x28)) {
      iVar3 = socket(*(int *)((long)tVar6._M_id._M_thread + 4),
                     *(int *)((long)tVar6._M_id._M_thread + 8),
                     *(int *)((long)tVar6._M_id._M_thread + 0xc));
      *(int *)pcVar2 = iVar3;
      if (iVar3 == -1) {
        perror("socket");
      }
      else {
        iVar3 = connect(iVar3,*(sockaddr **)((long)tVar6._M_id._M_thread + 0x18),
                        *(socklen_t *)((long)tVar6._M_id._M_thread + 0x10));
        if (iVar3 != -1) {
          memcpy(servers[0].addr.__ss_padding + lVar7 + -2,
                 *(sockaddr **)((long)tVar6._M_id._M_thread + 0x18),
                 (ulong)*(socklen_t *)((long)tVar6._M_id._M_thread + 0x10));
          *(ulong *)((long)(&servers[0].addr + 1) + lVar7) =
               (ulong)*(socklen_t *)((long)tVar6._M_id._M_thread + 0x10);
          *(int *)((long)&servers[0].family + lVar7) = *(int *)((long)tVar6._M_id._M_thread + 4);
          *(int *)((long)&servers[0].protocol + lVar7) = *(int *)((long)tVar6._M_id._M_thread + 0xc)
          ;
          goto LAB_001042e2;
        }
        perror("connect");
        close(*(int *)pcVar2);
      }
    }
    util::fatal("Couldn\'t establish a connection to %s:%hu",
                *(undefined8 *)((long)&servers[0].hostname._M_dataplus._M_p + lVar7),
                (ulong)*(ushort *)((long)&servers[0].port + lVar7));
LAB_001042e2:
    freeaddrinfo((addrinfo *)local_f8._M_id._M_thread);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    lVar7 = lVar7 + 200;
    if (lVar7 == 400) {
      local_7c = 1;
      iVar3 = setsockopt(servers[1].socket,6,1,&local_7c,4);
      if (iVar3 < 0) {
        util::fatal("Couldn\'t turn off Nagle\'s algorithm");
      }
      std::thread::thread<void(&)(),,void>((thread *)local_c8,receive_game_job);
      std::thread::thread<void(&)(),,void>((thread *)&local_f0,receive_gui_job);
      std::thread::thread<void(&)(),,void>(&local_f8,send_game_job);
      std::thread::thread<void(&)(),,void>(&local_d0,send_gui_job);
      std::thread::join();
      std::thread::join();
      std::thread::join();
      std::thread::join();
      if (((local_d0._M_id._M_thread == 0) && (local_f8._M_id._M_thread == 0)) &&
         (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_f0._M_dataplus._M_p ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0 && (local_c8._0_8_ == 0)))) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p !=
            &local_78.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl.field_2) {
          operator_delete(local_78.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl._M_dataplus._M_p,
                          local_78.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Tuple_impl<1UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)&local_78.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .
                       super__Tuple_impl<1UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .
                       super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .
                       super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                       ._M_head_impl + 0x10U)) {
          operator_delete(local_78.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Tuple_impl<1UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl._M_dataplus._M_p,
                          local_78.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Tuple_impl<1UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl.field_2._M_allocated_capacity + 1);
        }
        return 0;
      }
      std::terminate();
    }
  } while( true );
}

Assistant:

int main(int argc, const char* argv[])
{
	session_id = static_cast<std::uint64_t>(time(nullptr));

	if (argc < 3)
	{
		printf(usage_msg);
		std::exit(1);
	}

	if (strlen(argv[1]) > 64)
		util::fatal("Given player name (%s) is longer than 64 chars\n", argv[1]);

	player_name = std::string(argv[1]);
	if (player_name.compare("\"\"") == 0)
		player_name = "";

	// Split to get optional port, server host will be validated later with getaddrinfo()
	auto server_address = split_hostname(argv[2]);
	game_server.hostname = std::get<0>(server_address);
	if (std::get<1>(server_address))
	{
		game_server.port = parse<std::uint16_t>(std::get<2>(server_address).data(), 0, 65535);
	}
	// Ditto optionally for ui server hostname
	if (argc >= 4)
	{
		auto server_address = split_hostname(argv[3]);
		gui_server.hostname = std::get<0>(server_address);
		if (std::get<1>(server_address))
		{
			gui_server.port = parse<std::uint16_t>(std::get<2>(server_address).data(), 0, 65535);
		}
	}


#ifdef _WIN32
	WORD wVersionRequested;
	WSADATA wsaData;

	/* Use the MAKEWORD(lowbyte, highbyte) macro declared in Windef.h */
	wVersionRequested = MAKEWORD(2, 2);

	int err = WSAStartup(wVersionRequested, &wsaData);
	if (err != 0) {
		/* Tell the user that we could not find a usable */
		/* Winsock DLL.                                  */
		printf("WSAStartup failed with error: %d\n", err);
		return 1;
	}
#define close closesocket
#endif

	// Try to create sockets and connect via either IPv4 or IPv6 to game and ui server
	for (auto& server : servers)
	{
		const auto port = std::to_string(server.port);

		addrinfo hints, *res;
		memset(&hints, 0x00, sizeof(hints));
		hints.ai_socktype = server.desired_socktype;

		int error = getaddrinfo(server.hostname.c_str(), port.c_str(), &hints, &res);
		if (error != 0)
			util::fatal("Couldn't resolve %s", server.hostname.c_str());

		addrinfo* p;
		for (p = res; p != nullptr; p = p->ai_next)
		{
			auto& sock = server.socket;
			if ((sock = socket(p->ai_family, p->ai_socktype, p->ai_protocol)) == -1)
			{
				perror("socket");
				continue;
			}

			if (connect(sock, p->ai_addr, p->ai_addrlen) == -1)
			{
				perror("connect");
				close(sock);
				continue;
			}

			memcpy(&server.addr, p->ai_addr, p->ai_addrlen);
			server.addrlen = p->ai_addrlen;
			server.family = p->ai_family;
			server.protocol = p->ai_protocol;
			break;
		}

		if (p == nullptr)
			util::fatal("Couldn't establish a connection to %s:%hu", server.hostname.c_str(), server.port);

		freeaddrinfo(res);
	}

	// Turn off Nagle's algorithm for GUI TCP connection
	int off = 1;
	int result = setsockopt(gui_server.socket, IPPROTO_TCP, TCP_NODELAY, (const char*)&off, sizeof(off));
	if (result < 0)
		util::fatal("Couldn't turn off Nagle's algorithm");

	// TODO: Implement server<>client and client<>GUI communication
	std::thread recv_game(receive_game_job);
	std::thread recv_gui(receive_gui_job);
	std::thread send_game(send_game_job);
	std::thread send_gui(send_gui_job);

	recv_game.join();
	recv_gui.join();
	send_game.join();
	send_gui.join();

	return 0;
}